

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5TripCursors(Fts5FullTable *pTab)

{
  Fts5Cursor *pFVar1;
  Fts5Cursor **ppFVar2;
  
  ppFVar2 = &pTab->pGlobal->pCsr;
  while (pFVar1 = *ppFVar2, pFVar1 != (Fts5Cursor *)0x0) {
    if ((pFVar1->ePlan == 1) && ((Fts5FullTable *)(pFVar1->base).pVtab == pTab)) {
      *(byte *)&pFVar1->csrflags = (byte)pFVar1->csrflags | 0x20;
    }
    ppFVar2 = &pFVar1->pNext;
  }
  return;
}

Assistant:

static void fts5TripCursors(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->ePlan==FTS5_PLAN_MATCH
     && pCsr->base.pVtab==(sqlite3_vtab*)pTab 
    ){
      CsrFlagSet(pCsr, FTS5CSR_REQUIRE_RESEEK);
    }
  }
}